

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscSymbolTable.h
# Opt level: O0

void __thiscall CNscSymbolTable::MakeRoom(CNscSymbolTable *this,size_t nSize)

{
  void *__dest;
  long in_RSI;
  undefined8 *in_RDI;
  uchar *pauchNew;
  
  if ((ulong)in_RDI[2] < (ulong)(in_RDI[1] + in_RSI)) {
    do {
      in_RDI[2] = in_RDI[3] + in_RDI[2];
    } while ((ulong)in_RDI[2] < (ulong)(in_RDI[1] + in_RSI));
    __dest = operator_new__(in_RDI[2]);
    if (in_RDI[1] == 0) {
      in_RDI[1] = 1;
    }
    else {
      memmove(__dest,(void *)*in_RDI,in_RDI[1]);
      if ((void *)*in_RDI != (void *)0x0) {
        operator_delete__((void *)*in_RDI);
      }
    }
    *in_RDI = __dest;
  }
  return;
}

Assistant:

void MakeRoom (size_t nSize)
	{
		if (m_nSize + nSize > m_nAllocated)
		{
			do 
			{
				m_nAllocated += m_nGrowSize;
			} while (m_nSize + nSize > m_nAllocated);
			unsigned char *pauchNew = new unsigned char [m_nAllocated];
			if (m_nSize == 0)
				m_nSize = 1;
			else
			{
				memmove (pauchNew, m_pauchData, m_nSize);
				delete [] m_pauchData;
			}
			m_pauchData = pauchNew;
		}
	}